

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void outflushn(int nl)

{
  int in_stack_0000000c;
  out_stream_info *in_stack_00000010;
  
  outflushn_stream(in_stack_00000010,in_stack_0000000c);
  if (logfp != (osfildef *)0x0) {
    outflushn_stream(in_stack_00000010,in_stack_0000000c);
    fflush((FILE *)logfp);
  }
  return;
}

Assistant:

void outflushn(int nl)
{
    /* flush the display stream */
    outflushn_stream(&G_std_disp, nl);

    /* flush the log stream, if we have an open log file */
    if (logfp != 0)
    {
        outflushn_stream(&G_log_disp, nl);
        osfflush(logfp);
    }
}